

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

float calculate_volume(DUMB_IT_SIGRENDERER *sigrenderer,IT_PLAYING *playing,double volume)

{
  byte bVar1;
  int iVar2;
  long in_RSI;
  long *in_RDI;
  double in_XMM0_Qa;
  int v2;
  int f2;
  int f;
  int v;
  int vol;
  uint local_44;
  int local_28;
  uint local_24;
  double local_20;
  
  if ((in_XMM0_Qa != 0.0) || (local_20 = in_XMM0_Qa, NAN(in_XMM0_Qa))) {
    if ((**(uint **)(in_RSI + 8) & 1) != 0) {
      return 0.0;
    }
    if ((*(byte *)(*(long *)(in_RSI + 8) + 0x41) & 0xc0) == 0x80) {
      return 0.0;
    }
    switch(*(undefined1 *)(in_RSI + 0x59)) {
    case 1:
      local_24 = (uint)"@??>>==<<;;::99887766554433221100//..--,,++**))((\'\'&&%%$$##\"\"!!  \x1f\x1f\x1e\x1e\x1d\x1d\x1c\x1c\x1b\x1b\x1a\x1a\x19\x19\x18\x18\x17\x17\x16\x16\x15\x15\x14\x14\x13\x13\x12\x12\x11\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\v\v\n\n\t\t\b\b\a\a\x06\x06\x05\x05\x04\x04\x03\x03\x02\x02\x01\x01"
                       [*(byte *)(in_RSI + 0x58)];
      break;
    case 2:
      local_24 = (uint)"@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@"
                       [*(byte *)(in_RSI + 0x58)];
      break;
    case 3:
      iVar2 = rand();
      local_24 = iVar2 % 0x81 + -0x40;
      break;
    case 4:
      local_24 = (uint)it_xm_squarewave[*(byte *)(in_RSI + 0x58)];
      break;
    case 5:
      local_24 = (uint)""[*(byte *)(in_RSI + 0x58)];
      break;
    case 6:
      if ((*(uint *)(*in_RDI + 100) & 0x80) == 0) {
        bVar1 = *(byte *)(in_RSI + 0x58);
      }
      else {
        bVar1 = *(byte *)(in_RSI + 0x54);
      }
      local_44 = (uint)bVar1;
      local_24 = (uint)""[(int)(0xff - local_44)];
      break;
    default:
      local_24 = (uint)""[*(byte *)(in_RSI + 0x58)];
    }
    local_24 = (uint)*(byte *)(in_RSI + 0x45) * 0x20 + *(byte *)(in_RSI + 0x57) * local_24;
    if ((int)local_24 < 1) {
      return 0.0;
    }
    if (0x800 < (int)local_24) {
      local_24 = 0x800;
    }
    if ((*(uint *)(*in_RDI + 100) & 0x200) != 0) {
      local_28 = aiPTMVolScaled[(int)local_24 >> 5];
      if ((int)local_24 < 0x800) {
        local_28 = (int)(local_28 * (0x20 - (local_24 & 0x1f)) +
                        aiPTMVolScaled[((int)local_24 >> 5) + 1] * (local_24 & 0x1f)) >> 5;
      }
      local_24 = local_28 << 1;
    }
    local_20 = (double)*(int *)(*in_RDI + 0x6c) *
               (double)*(byte *)(in_RDI + 2) *
               (double)*(byte *)(in_RSI + 0x44) *
               (double)*(byte *)(*(long *)(in_RSI + 0x10) + 0x33) *
               (double)(int)local_24 * in_XMM0_Qa * 7.275957614183426e-12;
    if (((local_20 != 0.0) || (NAN(local_20))) && (*(long *)(in_RSI + 0x18) != 0)) {
      if (((*(byte *)(in_RSI + 0x4b) & 1) != 0) &&
         (*(char *)(*(long *)(in_RSI + 0x20) + 0x31) != '\0')) {
        iVar2 = envelope_get_y((IT_ENVELOPE *)(*(long *)(in_RSI + 0x20) + 0x30),
                               (IT_PLAYING_ENVELOPE *)(in_RSI + 0x74));
        local_20 = (double)iVar2 * local_20 * 6.103515625e-05;
      }
      local_20 = (double)*(int *)(in_RSI + 0x98) *
                 (double)*(byte *)(*(long *)(in_RSI + 0x18) + 299) * local_20 * 7.62939453125e-06;
    }
  }
  return (float)local_20;
}

Assistant:

static float calculate_volume(DUMB_IT_SIGRENDERER *sigrenderer, IT_PLAYING *playing, double volume)
{
	if (volume != 0) {
		int vol;

		if (playing->channel->flags & IT_CHANNEL_MUTED)
			return 0;

		if ((playing->channel->tremor_time & 192) == 128)
			return 0;

		switch (playing->tremolo_waveform)
		{
		default:
			vol = it_sine[playing->tremolo_time];
			break;
		case 1:
			vol = it_sawtooth[playing->tremolo_time];
			break;
		case 2:
			vol = it_squarewave[playing->tremolo_time];
			break;
		case 3:
			vol = (rand() % 129) - 64;
			break;
		case 4:
			vol = it_xm_squarewave[playing->tremolo_time];
			break;
		case 5:
			vol = it_xm_ramp[playing->tremolo_time];
			break;
		case 6:
			vol = it_xm_ramp[255-((sigrenderer->sigdata->flags & IT_WAS_A_MOD)?playing->vibrato_time:playing->tremolo_time)];
			break;
		}
		vol *= playing->tremolo_depth;

		vol = (playing->volume << 5) + vol;

		if (vol <= 0)
			return 0;

		if (vol > 64 << 5)
			vol = 64 << 5;

		if ( sigrenderer->sigdata->flags & IT_WAS_A_PTM )
		{
			int v = aiPTMVolScaled[ vol >> 5 ];
			if ( vol < 64 << 5 )
			{
				int f = vol & ( ( 1 << 5 ) - 1 );
				int f2 = ( 1 << 5 ) - f;
				int v2 = aiPTMVolScaled[ ( vol >> 5 ) + 1 ];
				v = ( v * f2 + v2 * f ) >> 5;
			}
			vol = v << 1;
		}

		volume *= vol; /* 64 << 5 */
		volume *= playing->sample->global_volume; /* 64 */
		volume *= playing->channel_volume; /* 64 */
		volume *= sigrenderer->globalvolume; /* 128 */
		volume *= sigrenderer->sigdata->mixing_volume; /* 128 */
		volume *= 1.0f / ((64 << 5) * 64.0f * 64.0f * 128.0f * 128.0f);

		if (volume && playing->instrument) {
			if (playing->enabled_envelopes & IT_ENV_VOLUME && playing->env_instrument->volume_envelope.n_nodes) {
				volume *= envelope_get_y(&playing->env_instrument->volume_envelope, &playing->volume_envelope);
				volume *= 1.0f / (64 << IT_ENVELOPE_SHIFT);
			}
			volume *= playing->instrument->global_volume; /* 128 */
			volume *= playing->fadeoutcount; /* 1024 */
			volume *= 1.0f / (128.0f * 1024.0f);
		}
	}

	return (float)volume;
}